

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O2

bool __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::validate<false>
          (InputParameter<3UL,_ruckig::StandardVector> *this,bool check_current_state_within_limits,
          bool check_target_state_within_limits)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  array<double,_3UL> *paVar7;
  array<ruckig::ControlInterface,_3UL> *paVar8;
  ControlInterface *pCVar9;
  long lVar10;
  size_t dof;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  
  lVar10 = 0;
  for (uVar11 = 0; uVar11 < this->degrees_of_freedom; uVar11 = uVar11 + 1) {
    dVar2 = *(double *)((long)(this->max_jerk)._M_elems + lVar10 * 2);
    if ((dVar2 < 0.0) ||
       (dVar3 = *(double *)((long)(this->max_acceleration)._M_elems + lVar10 * 2), dVar3 < 0.0))
    goto LAB_0010f2af;
    if ((this->min_acceleration).super__Optional_base<std::array<double,_3UL>,_true,_true>.
        _M_payload.super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == true) {
      paVar7 = std::optional<std::array<double,_3UL>_>::value(&this->min_acceleration);
      dVar13 = *(double *)((long)paVar7->_M_elems + lVar10 * 2);
    }
    else {
      dVar13 = -dVar3;
    }
    if (((0.0 < dVar13) ||
        (dVar4 = *(double *)((long)(this->current_acceleration)._M_elems + lVar10 * 2), NAN(dVar4)))
       || (dVar5 = *(double *)((long)(this->target_acceleration)._M_elems + lVar10 * 2), NAN(dVar5))
       ) goto LAB_0010f2af;
    if (check_current_state_within_limits) {
      if (dVar3 < dVar4) {
        return false;
      }
      if (dVar4 < dVar13) {
        return false;
      }
    }
    if (check_target_state_within_limits) {
      if (dVar3 < dVar5) {
        return false;
      }
      if (dVar5 < dVar13) {
        return false;
      }
    }
    dVar3 = *(double *)((long)(this->current_velocity)._M_elems + lVar10 * 2);
    if ((NAN(dVar3)) ||
       (dVar13 = *(double *)((long)(this->target_velocity)._M_elems + lVar10 * 2), NAN(dVar13)))
    goto LAB_0010f2af;
    pCVar9 = &this->control_interface;
    if ((this->per_dof_control_interface).
        super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>._M_payload.
        super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>._M_engaged == true)
    {
      paVar8 = std::optional<std::array<ruckig::ControlInterface,_3UL>_>::value
                         (&this->per_dof_control_interface);
      pCVar9 = (ControlInterface *)((long)paVar8->_M_elems + lVar10);
    }
    if (*pCVar9 == Position) {
      if (((NAN(*(double *)((long)(this->current_position)._M_elems + lVar10 * 2))) ||
          (NAN(*(double *)((long)(this->target_position)._M_elems + lVar10 * 2)))) ||
         (dVar6 = *(double *)((long)(this->max_velocity)._M_elems + lVar10 * 2), dVar6 < 0.0))
      goto LAB_0010f2af;
      if ((this->min_velocity).super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == true) {
        paVar7 = std::optional<std::array<double,_3UL>_>::value(&this->min_velocity);
        dVar14 = *(double *)((long)paVar7->_M_elems + lVar10 * 2);
      }
      else {
        dVar14 = -dVar6;
      }
      if (0.0 < dVar14) goto LAB_0010f2af;
      if (check_current_state_within_limits) {
        if (dVar6 < dVar3) {
          return false;
        }
        if (dVar3 < dVar14) {
          return false;
        }
      }
      if (check_target_state_within_limits) {
        if (dVar6 < dVar13) {
          return false;
        }
        if (dVar13 < dVar14) {
          return false;
        }
      }
      if (((check_current_state_within_limits) &&
          ((((0.0 < dVar2 && (0.0 < dVar4)) && (dVar6 < (dVar4 * dVar4) / (dVar2 + dVar2) + dVar3))
           || (((0.0 < dVar2 && (dVar4 < 0.0)) &&
               (dVar3 - (dVar4 * dVar4) / (dVar2 + dVar2) < dVar14)))))) ||
         ((check_target_state_within_limits &&
          ((((0.0 < dVar2 && (dVar5 < 0.0)) && (dVar6 < (dVar5 * dVar5) / (dVar2 + dVar2) + dVar13))
           || (((0.0 < dVar2 && (0.0 < dVar5)) &&
               (dVar13 - (dVar5 * dVar5) / (dVar2 + dVar2) < dVar14)))))))) goto LAB_0010f2af;
    }
    lVar10 = lVar10 + 4;
  }
  bVar12 = true;
  if ((((this->intermediate_positions).
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->intermediate_positions).
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) && (this->control_interface == Position)) &&
     ((bVar12 = false,
      (this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false &&
      (this->duration_discretization == Continuous)))) {
    if (((this->per_dof_control_interface).
         super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>._M_payload.
         super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>._M_engaged ==
         false) &&
       ((this->per_dof_synchronization).
        super__Optional_base<std::array<ruckig::Synchronization,_3UL>,_true,_true>._M_payload.
        super__Optional_payload_base<std::array<ruckig::Synchronization,_3UL>_>._M_engaged == false)
       ) {
      uVar11 = 0;
      do {
        bVar12 = this->degrees_of_freedom == uVar11;
        if (bVar12) {
          return bVar12;
        }
        pdVar1 = (this->max_jerk)._M_elems + uVar11;
        uVar11 = uVar11 + 1;
      } while (ABS(*pdVar1) != INFINITY);
    }
    else {
LAB_0010f2af:
      bVar12 = false;
    }
  }
  return bVar12;
}

Assistant:

bool validate(bool check_current_state_within_limits = false, bool check_target_state_within_limits = true) const {
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const double jMax = max_jerk[dof];
            if (std::isnan(jMax) || jMax < 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("maximum jerk limit " + std::to_string(jMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                }
                return false;
            }

            const double aMax = max_acceleration[dof];
            if (std::isnan(aMax) || aMax < 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("maximum acceleration limit " + std::to_string(aMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                }
                return false;
            }

            const double aMin = min_acceleration ? min_acceleration.value()[dof] : -max_acceleration[dof];
            if (std::isnan(aMin) || aMin > 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("minimum acceleration limit " + std::to_string(aMin) + " of DoF " + std::to_string(dof) + " should be smaller than or equal to zero.");
                }
                return false;
            }

            const double a0 = current_acceleration[dof];
            if (std::isnan(a0)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }
            const double af = target_acceleration[dof];
            if (std::isnan(af)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }

            if (check_current_state_within_limits) {
                if (a0 > aMax) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " exceeds its maximum acceleration limit " + std::to_string(aMax) + ".");
                    }
                    return false;
                }
                if (a0 < aMin) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " undercuts its minimum acceleration limit " + std::to_string(aMin) + ".");
                    }
                    return false;
                }
            }
            if (check_target_state_within_limits) {
                if (af > aMax) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " exceeds its maximum acceleration limit " + std::to_string(aMax) + ".");
                    }
                    return false;
                }
                if (af < aMin) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " undercuts its minimum acceleration limit " + std::to_string(aMin) + ".");
                    }
                    return false;
                }
            }

            const double v0 = current_velocity[dof];
            if (std::isnan(v0)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }
            const double vf = target_velocity[dof];
            if (std::isnan(vf)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }

            auto control_interface_ = per_dof_control_interface ? per_dof_control_interface.value()[dof] : control_interface;
            if (control_interface_ == ControlInterface::Position) {
                const double p0 = current_position[dof];
                if (std::isnan(p0)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current position " + std::to_string(p0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                    }
                    return false;
                }
                const double pf = target_position[dof];
                if (std::isnan(pf)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target position " + std::to_string(pf) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                    }
                    return false;
                }

                const double vMax = max_velocity[dof];
                if (std::isnan(vMax) || vMax < 0.0) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("maximum velocity limit " + std::to_string(vMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                    }
                    return false;
                }

                const double vMin = min_velocity ? min_velocity.value()[dof] : -max_velocity[dof];
                if (std::isnan(vMin) || vMin > 0.0) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("minimum velocity limit " + std::to_string(vMin) + " of DoF " + std::to_string(dof) + " should be smaller than or equal to zero.");
                    }
                    return false;
                }

                if (check_current_state_within_limits) {
                    if (v0 > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " exceeds its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (v0 < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " undercuts its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
                if (check_target_state_within_limits) {
                    if (vf > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " exceeds its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (vf < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " undercuts its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }

                if (check_current_state_within_limits) {
                    if (a0 > 0 && jMax > 0 && v_at_a_zero(v0, a0, jMax) > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably reach a velocity " + std::to_string(v_at_a_zero(v0, a0, jMax)) + " from the current kinematic state that will exceed its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (a0 < 0 && jMax > 0 && v_at_a_zero(v0, a0, -jMax) < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably reach a velocity " + std::to_string(v_at_a_zero(v0, a0, -jMax)) + " from the current kinematic state that will undercut its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
                if (check_target_state_within_limits) {
                    if (af < 0 && jMax > 0 && v_at_a_zero(vf, af, jMax) > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably have reached a velocity " + std::to_string(v_at_a_zero(vf, af, jMax)) + " from the target kinematic state that will exceed its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (af > 0 && jMax > 0 && v_at_a_zero(vf, af, -jMax) < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably have reached a velocity " + std::to_string(v_at_a_zero(vf, af, -jMax)) + " from the target kinematic state that will undercut its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
            }
        }

        if (!intermediate_positions.empty() && control_interface == ControlInterface::Position) {
            if (minimum_duration || duration_discretization != DurationDiscretization::Continuous) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("Intermediate position can not be used together with a global minimum or discrete duration.");
                }
                return false;
            }

            if (per_dof_control_interface || per_dof_synchronization) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("Intermediate positions can only be used together with the position control interface and a global synchronization.");
                }
                return false;
            }

            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                const double jMax = max_jerk[dof];
                if (std::isinf(jMax)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("infinite jerk limit of DoF " + std::to_string(dof) + " is currently not supported with intermediate positions.");
                    }
                    return false;
                }
            }
        }

        return true;
    }